

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartApi.cpp
# Opt level: O3

void anon_unknown.dwarf_224fb3::testWriteRead
               (int partNumber,int runCount,int randomReadCount,string *tempDir)

{
  float fVar1;
  pointer pcVar2;
  size_type sVar3;
  FrameBuffer *pFVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined8 uVar8;
  Header *pHVar9;
  Header *pHVar10;
  char cVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined4 uVar16;
  int width;
  int iVar17;
  int iVar18;
  int iVar19;
  ostream *poVar20;
  char *pcVar21;
  TileDescription *pTVar22;
  long lVar23;
  TiledOutputPart *pTVar24;
  ulong uVar25;
  ulong *puVar26;
  size_type *psVar27;
  OutputPart *this;
  ThreadPool *pTVar28;
  pointer ppWVar29;
  pointer __dest;
  undefined8 *puVar30;
  undefined8 *puVar31;
  float *pfVar32;
  float *pfVar33;
  int *piVar34;
  ChannelList *this_00;
  ChannelList *pCVar35;
  Task *pTVar36;
  void *pvVar37;
  long lVar38;
  ulong *puVar39;
  int iVar40;
  Header *this_01;
  ulong uVar41;
  _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
  *this_02;
  uint uVar42;
  uint uVar43;
  int iVar44;
  ulong uVar45;
  WritingTaskData *pWVar46;
  size_t __n;
  TaskGroup *__n_00;
  size_type sVar47;
  ulong uVar48;
  long *plVar49;
  pointer ppWVar50;
  size_type *psVar51;
  size_type *psVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  TaskGroup taskGroup;
  MultiPartOutputFile file;
  Array2D<float> floatData;
  int numYLevel;
  int numXLevel;
  Array2D<unsigned_int> uintData;
  Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_> tiledFrameBuffers;
  Array2D<Imath_3_2::half> halfData;
  vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> frameBuffers;
  string fn;
  vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
  taskList;
  vector<void_*,_std::allocator<void_*>_> parts;
  pointer local_390;
  pointer local_388;
  TiledOutputPart *local_368;
  uint local_35c;
  Array2D<float> local_358;
  size_type *local_338;
  size_type *local_330;
  Array2D<float> local_328;
  ulong local_308;
  Task *local_300;
  size_t local_2f8;
  ThreadPool *local_2f0;
  Array2D<Imf_3_2::FrameBuffer> *local_2e8;
  int local_2e0;
  int local_2dc;
  Array2D<unsigned_int> local_2d8;
  Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_> local_2b8;
  Array2D<Imath_3_2::half> local_2a8;
  Array2D<unsigned_int> local_288 [2];
  size_type *local_250;
  long *local_248 [2];
  long local_238 [2];
  int local_224;
  int local_220;
  int local_21c;
  void *local_218;
  long lStack_210;
  long local_208;
  size_type *local_1f8;
  size_type *local_1f0;
  size_type *local_1e8;
  size_type *local_1e0;
  size_type *local_1d8;
  size_type *local_1d0;
  size_t local_1c8;
  ulong local_1c0;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  local_1b8 [2];
  ios_base local_138 [264];
  
  local_220 = randomReadCount;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing file with ",0x12);
  local_35c = partNumber;
  poVar20 = (ostream *)std::ostream::operator<<(&std::cout,partNumber);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20," part(s).",9);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
  std::ostream::put((char)poVar20);
  std::ostream::flush();
  std::ostream::flush();
  local_248[0] = local_238;
  pcVar2 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,pcVar2,pcVar2 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_248);
  local_224 = runCount;
  if (0 < runCount) {
    local_308 = (ulong)local_35c;
    local_1c0 = local_308 * 0x18 + 8;
    local_1c8 = ((local_308 * 0x18 - 0x18) / 0x18) * 0x18 + 0x18;
    iVar13 = 0;
    do {
      local_2a8._sizeX = 0;
      local_2a8._sizeY = 0;
      local_2a8._data = (half *)0x0;
      local_328._data = (float *)0x0;
      local_328._sizeX = 0;
      local_328._sizeY = 0;
      local_2d8._data = (uint *)0x0;
      local_2d8._sizeX = 0;
      local_2d8._sizeY = 0;
      local_21c = iVar13;
      fillPixels<unsigned_int>(&local_2d8,0xc5,0x107);
      fillPixels<Imath_3_2::half>(&local_2a8,0xc5,0x107);
      fillPixels<float>(&local_328,0xc5,0x107);
      uVar25 = local_1c0;
      local_1e8 = (size_type *)operator_new__(local_1c0);
      sVar5 = local_1c8;
      uVar48 = local_308;
      *local_1e8 = local_308;
      local_1e0 = local_1e8 + 1;
      memset(local_1e0,0,local_1c8);
      local_1f0 = (size_type *)operator_new__(uVar25);
      *local_1f0 = uVar48;
      local_1d8 = local_1f0 + 1;
      memset(local_1d8,0,sVar5);
      local_1f8 = (size_type *)operator_new__(uVar25);
      *local_1f8 = uVar48;
      local_1d0 = local_1f8 + 1;
      memset(local_1d0,0,sVar5);
      local_218 = (void *)0x0;
      lStack_210 = 0;
      local_208 = 0;
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::pixelTypes,uVar48);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::partTypes,local_308);
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::levelModes,local_308);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Generating headers and data ",0x1c);
      std::ostream::flush();
      pHVar10 = DAT_001f0c20;
      pHVar9 = (anonymous_namespace)::headers;
      this_01 = (anonymous_namespace)::headers;
      if (DAT_001f0c20 != (anonymous_namespace)::headers) {
        do {
          Imf_3_2::Header::~Header(this_01);
          this_01 = this_01 + 0x38;
        } while (this_01 != pHVar10);
        DAT_001f0c20 = pHVar9;
      }
      if (0 < (int)local_35c) {
        sVar47 = 0;
        do {
          local_1b8[0]._M_impl._0_8_ = 0;
          Imf_3_2::Header::Header
                    ((Header *)local_288,0xc5,0x107,1.0,(Vec2 *)local_1b8,1.0,INCREASING_Y,
                     ZIP_COMPRESSION);
          iVar13 = random_int(3);
          iVar14 = random_int(2);
          *(int *)((anonymous_namespace)::pixelTypes + sVar47 * 4) = iVar13;
          *(int *)((anonymous_namespace)::partTypes + sVar47 * 4) = iVar14;
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          iVar15 = (int)sVar47;
          std::ostream::operator<<
                    (&local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent,iVar15);
          std::__cxx11::stringbuf::str();
          Imf_3_2::Header::setName((string *)local_288);
          if ((float **)local_358._sizeX != &local_358._data) {
            operator_delete((void *)local_358._sizeX,(long)local_358._data + 1);
          }
          if (iVar13 == 0) {
            pcVar21 = (char *)Imf_3_2::Header::channels();
            Imf_3_2::Channel::Channel((Channel *)&local_358,UINT,1,1,false);
            Imf_3_2::ChannelList::insert(pcVar21,(Channel *)"UINT");
          }
          else if (iVar13 == 1) {
            pcVar21 = (char *)Imf_3_2::Header::channels();
            Imf_3_2::Channel::Channel((Channel *)&local_358,FLOAT,1,1,false);
            Imf_3_2::ChannelList::insert(pcVar21,(Channel *)"FLOAT");
          }
          else if (iVar13 == 2) {
            pcVar21 = (char *)Imf_3_2::Header::channels();
            Imf_3_2::Channel::Channel((Channel *)&local_358,HALF,1,1,false);
            Imf_3_2::ChannelList::insert(pcVar21,(Channel *)"HALF");
          }
          if (iVar14 == 1) {
            Imf_3_2::Header::setType((string *)local_288);
            iVar13 = random_int(0xc5);
            iVar14 = random_int(0x107);
            uVar43 = random_int(3);
            *(uint *)((anonymous_namespace)::levelModes + sVar47 * 4) = uVar43;
            uVar42 = 3;
            if (uVar43 < 3) {
              uVar42 = uVar43;
            }
            local_358._sizeX = CONCAT44(iVar14 + 1,iVar13 + 1);
            local_358._sizeY = (long)uVar42;
            Imf_3_2::Header::setTileDescription((TileDescription *)local_288);
            bVar12 = uVar43 != 1;
LAB_00186939:
            pTVar22 = (TileDescription *)Imf_3_2::Header::tileDescription();
            Imf_3_2::precalculateTileInfo
                      (pTVar22,0,0xc4,0,0x106,(int **)&local_2b8,(int **)&local_368,&local_2dc,
                       &local_2e0);
            if (0 < local_2dc) {
              lVar23 = 0;
              iVar13 = local_2dc;
              iVar14 = local_2e0;
              do {
                if (0 < iVar14) {
                  lVar38 = 0;
                  do {
                    if ((!(bool)(~bVar12 & lVar23 != lVar38)) &&
                       (0 < *(int *)(local_2b8._size + lVar23 * 4))) {
                      iVar13 = 0;
                      pTVar24 = local_368;
                      pvVar37 = (void *)local_2b8._size;
                      do {
                        if (0 < *(int *)(pTVar24 + lVar38 * 4)) {
                          iVar14 = 0;
                          do {
                            local_358._sizeX = CONCAT44(iVar13,iVar15);
                            local_358._sizeY = CONCAT44((int)lVar23,iVar14);
                            local_358._data = (float *)CONCAT44(local_358._data._4_4_,(int)lVar38);
                            std::
                            vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                            ::push_back((vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                                         *)&local_218,(value_type *)&local_358);
                            iVar14 = iVar14 + 1;
                            pTVar24 = local_368;
                            pvVar37 = (void *)local_2b8._size;
                          } while (iVar14 < *(int *)(local_368 + lVar38 * 4));
                        }
                        iVar13 = iVar13 + 1;
                        iVar14 = local_2e0;
                      } while (iVar13 < *(int *)((long)pvVar37 + lVar23 * 4));
                    }
                    lVar38 = lVar38 + 1;
                    iVar13 = local_2dc;
                  } while (lVar38 < iVar14);
                }
                lVar23 = lVar23 + 1;
              } while (lVar23 < iVar13);
            }
            if ((void *)local_2b8._size != (void *)0x0) {
              operator_delete__((void *)local_2b8._size);
            }
            if (local_368 != (TiledOutputPart *)0x0) {
              operator_delete__(local_368);
            }
          }
          else {
            bVar12 = true;
            if (iVar14 != 0) goto LAB_00186939;
            Imf_3_2::Header::setType((string *)local_288);
            iVar13 = 0x107;
            do {
              local_358._sizeX = CONCAT44(local_358._sizeX._4_4_,iVar15);
              std::
              vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
              ::push_back((vector<(anonymous_namespace)::WritingTaskData,_std::allocator<(anonymous_namespace)::WritingTaskData>_>
                           *)&local_218,(value_type *)&local_358);
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                    ((vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> *)
                     &(anonymous_namespace)::headers,(value_type *)local_288);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          Imf_3_2::Header::~Header((Header *)local_288);
          sVar47 = sVar47 + 1;
        } while (sVar47 != local_308);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Shuffling ",10);
      pvVar37 = local_218;
      psVar52 = (size_type *)((lStack_210 - (long)local_218 >> 2) * -0x3333333333333333);
      poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20," tasks ",7);
      std::ostream::flush();
      iVar13 = (int)psVar52;
      uVar48 = (ulong)psVar52 & 0xffffffff;
      if (0 < iVar13) {
        do {
          iVar14 = random_int(iVar13);
          iVar15 = random_int(iVar13);
          lVar38 = (long)iVar14;
          lVar23 = (long)iVar15;
          uVar16 = *(undefined4 *)((long)pvVar37 + lVar38 * 0x14 + 0x10);
          local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)
               CONCAT44(local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,uVar16)
          ;
          puVar26 = (ulong *)((long)pvVar37 + lVar38 * 0x14);
          local_1b8[0]._M_impl._0_8_ = *puVar26;
          local_1b8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ = puVar26[1];
          *(undefined4 *)((long)pvVar37 + lVar38 * 0x14 + 0x10) =
               *(undefined4 *)((long)pvVar37 + lVar23 * 0x14 + 0x10);
          puVar30 = (undefined8 *)((long)pvVar37 + lVar23 * 0x14);
          uVar8 = puVar30[1];
          puVar31 = (undefined8 *)((long)pvVar37 + lVar38 * 0x14);
          *puVar31 = *puVar30;
          puVar31[1] = uVar8;
          *(undefined4 *)((long)pvVar37 + lVar23 * 0x14 + 0x10) = uVar16;
          puVar26 = (ulong *)((long)pvVar37 + lVar23 * 0x14);
          *puVar26 = local_1b8[0]._M_impl._0_8_;
          puVar26[1] = local_1b8[0]._M_impl.super__Rb_tree_header._M_header._0_8_;
          uVar42 = (int)uVar48 - 1;
          uVar48 = (ulong)uVar42;
        } while (uVar42 != 0);
      }
      local_250 = psVar52;
      remove((char *)local_248[0]);
      plVar49 = local_248[0];
      pHVar10 = DAT_001f0c20;
      pHVar9 = (anonymous_namespace)::headers;
      iVar13 = Imf_3_2::globalThreadCount();
      Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
                ((MultiPartOutputFile *)&local_358,(char *)plVar49,pHVar9,
                 (int)((ulong)((long)pHVar10 - (long)pHVar9) >> 3) * -0x49249249,false,iVar13);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Writing tasks ",0xe)
      ;
      std::ostream::flush();
      uVar48 = local_308;
      local_1b8[0]._M_impl._0_8_ = (void *)0x0;
      local_1b8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
      local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::vector
                ((vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> *)local_288,
                 local_308,(allocator_type *)&local_2b8);
      Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_>::Array(&local_2b8,uVar48);
      if (0 < (int)local_35c) {
        uVar48 = 0;
        do {
          if (*(int *)((anonymous_namespace)::partTypes + uVar48 * 4) == 0) {
            this = (OutputPart *)operator_new(8);
            Imf_3_2::OutputPart::OutputPart(this,(MultiPartOutputFile *)&local_358,(int)uVar48);
            local_368 = (TiledOutputPart *)this;
            std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                      ((vector<void*,std::allocator<void*>> *)local_1b8,&local_368);
            setOutputFrameBuffer
                      ((FrameBuffer *)(local_288[0]._sizeX + uVar48 * 0x30),
                       *(int *)((anonymous_namespace)::pixelTypes + uVar48 * 4),
                       (Array2D<unsigned_int> *)local_2d8._data,(Array2D<float> *)local_328._data,
                       (Array2D<Imath_3_2::half> *)local_2a8._data,0xc5);
            Imf_3_2::OutputPart::setFrameBuffer((FrameBuffer *)this);
          }
          else {
            pTVar24 = (TiledOutputPart *)operator_new(8);
            Imf_3_2::TiledOutputPart::TiledOutputPart
                      (pTVar24,(MultiPartOutputFile *)&local_358,(int)uVar48);
            local_368 = pTVar24;
            std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                      ((vector<void*,std::allocator<void*>> *)local_1b8,&local_368);
            uVar16 = Imf_3_2::TiledOutputPart::numXLevels();
            local_2f0 = (ThreadPool *)CONCAT44(local_2f0._4_4_,uVar16);
            iVar13 = Imf_3_2::TiledOutputPart::numYLevels();
            local_2e8 = (Array2D<Imf_3_2::FrameBuffer> *)CONCAT44(local_2e8._4_4_,iVar13);
            local_338 = (size_type *)(long)iVar13;
            iVar13 = (int)local_2f0;
            sVar47 = (size_type)(int)local_2f0;
            uVar45 = (long)local_338 * sVar47;
            auVar6._8_8_ = 0;
            auVar6._0_8_ = uVar45;
            uVar25 = SUB168(auVar6 * ZEXT816(0x18),0);
            uVar41 = uVar25 + 8;
            if (0xfffffffffffffff7 < uVar25) {
              uVar41 = 0xffffffffffffffff;
            }
            if (SUB168(auVar6 * ZEXT816(0x18),8) != 0) {
              uVar41 = 0xffffffffffffffff;
            }
            puVar26 = (ulong *)operator_new__(uVar41);
            *puVar26 = uVar45;
            if (uVar45 != 0) {
              memset(puVar26 + 1,0,((uVar25 - 0x18) / 0x18) * 0x18 + 0x18);
            }
            local_300 = (Task *)(uVar48 * 3);
            local_330 = local_1d0 + uVar48 * 3;
            sVar3 = local_330[2];
            if (sVar3 != 0) {
              lVar23 = *(long *)(sVar3 - 8);
              if (lVar23 != 0) {
                lVar38 = lVar23 * 0x18;
                do {
                  pvVar37 = *(void **)((long)(sVar3 - 8) + lVar38);
                  if (pvVar37 != (void *)0x0) {
                    operator_delete__(pvVar37);
                  }
                  lVar38 = lVar38 + -0x18;
                } while (lVar38 != 0);
              }
              operator_delete__((void *)(sVar3 - 8),lVar23 * 0x18 + 8);
            }
            *local_330 = (size_type)local_338;
            local_330[1] = sVar47;
            local_330[2] = (size_type)(puVar26 + 1);
            puVar26 = (ulong *)operator_new__(uVar41);
            *puVar26 = uVar45;
            if (uVar45 != 0) {
              memset(puVar26 + 1,0,((uVar25 - 0x18) / 0x18) * 0x18 + 0x18);
            }
            psVar52 = local_1d8 + (long)local_300;
            sVar3 = psVar52[2];
            if (sVar3 != 0) {
              local_2f8 = *(size_t *)(sVar3 - 8);
              if (local_2f8 != 0) {
                lVar23 = local_2f8 * 0x18;
                do {
                  pvVar37 = *(void **)((long)(sVar3 - 8) + lVar23);
                  if (pvVar37 != (void *)0x0) {
                    operator_delete__(pvVar37);
                  }
                  lVar23 = lVar23 + -0x18;
                } while (lVar23 != 0);
              }
              operator_delete__((void *)(sVar3 - 8),local_2f8 * 0x18 + 8);
            }
            *psVar52 = (size_type)local_338;
            psVar52[1] = sVar47;
            psVar52[2] = (size_type)(puVar26 + 1);
            puVar26 = (ulong *)operator_new__(uVar41);
            *puVar26 = uVar45;
            if (uVar45 != 0) {
              memset(puVar26 + 1,0,((uVar25 - 0x18) / 0x18) * 0x18 + 0x18);
            }
            psVar51 = local_1e0 + (long)local_300;
            sVar3 = psVar51[2];
            if (sVar3 != 0) {
              lVar23 = *(long *)(sVar3 - 8);
              if (lVar23 != 0) {
                lVar38 = lVar23 * 0x18;
                do {
                  pvVar37 = *(void **)((long)(sVar3 - 8) + lVar38);
                  if (pvVar37 != (void *)0x0) {
                    operator_delete__(pvVar37);
                  }
                  lVar38 = lVar38 + -0x18;
                } while (lVar38 != 0);
              }
              operator_delete__((void *)(sVar3 - 8),lVar23 * 0x18 + 8);
            }
            auVar7._8_8_ = 0;
            auVar7._0_8_ = uVar45;
            uVar25 = SUB168(auVar7 * ZEXT816(0x30),0) | 8;
            *psVar51 = (size_type)local_338;
            psVar51[1] = sVar47;
            if (SUB168(auVar7 * ZEXT816(0x30),8) != 0) {
              uVar25 = 0xffffffffffffffff;
            }
            psVar51[2] = (size_type)(puVar26 + 1);
            plVar49 = &(local_2b8._data)->_sizeX + (long)local_300;
            puVar26 = (ulong *)operator_new__(uVar25);
            *puVar26 = uVar45;
            if (uVar45 != 0) {
              lVar23 = uVar45 * 0x30;
              puVar39 = puVar26 + 2;
              do {
                *(undefined4 *)puVar39 = 0;
                puVar39[1] = 0;
                puVar39[2] = (ulong)puVar39;
                puVar39[3] = (ulong)puVar39;
                puVar39[4] = 0;
                puVar39 = puVar39 + 6;
                lVar23 = lVar23 + -0x30;
              } while (lVar23 != 0);
            }
            pFVar4 = (FrameBuffer *)plVar49[2];
            if (pFVar4 != (FrameBuffer *)0x0) {
              local_2f8 = pFVar4[-1]._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
              if (local_2f8 != 0) {
                lVar23 = local_2f8 * 0x30;
                do {
                  std::
                  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                               *)(&pFVar4[-1]._map._M_t._M_impl.field_0x0 + lVar23));
                  lVar23 = lVar23 + -0x30;
                } while (lVar23 != 0);
              }
              operator_delete__(&pFVar4[-1]._map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                local_2f8 * 0x30 + 8);
            }
            *plVar49 = (long)local_338;
            plVar49[1] = sVar47;
            plVar49[2] = (long)(puVar26 + 1);
            if (0 < iVar13) {
              local_338 = (size_type *)((ulong)local_2f0 & 0xffffffff);
              uVar25 = (ulong)local_2e8 & 0xffffffff;
              psVar27 = (size_type *)0x0;
              do {
                if (0 < (int)local_2e8) {
                  uVar41 = 0;
                  do {
                    iVar13 = (int)pTVar24;
                    cVar11 = Imf_3_2::TiledOutputPart::isValidLevel(iVar13,(int)psVar27);
                    if (cVar11 != '\0') {
                      iVar14 = Imf_3_2::TiledOutputPart::levelWidth(iVar13);
                      iVar15 = Imf_3_2::TiledOutputPart::levelHeight(iVar13);
                      lVar23 = (&(local_2b8._data)->_sizeY)[(long)local_300];
                      pFVar4 = (&(local_2b8._data)->_data)[(long)local_300];
                      iVar13 = *(int *)((anonymous_namespace)::pixelTypes + uVar48 * 4);
                      if (iVar13 == 0) {
                        fillPixels<unsigned_int>
                                  ((Array2D<unsigned_int> *)
                                   (local_330[1] * uVar41 * 0x18 + local_330[2] +
                                   (long)psVar27 * 0x18),iVar14,iVar15);
                      }
                      else if (iVar13 == 1) {
                        fillPixels<float>((Array2D<float> *)
                                          (psVar52[1] * uVar41 * 0x18 + psVar52[2] +
                                          (long)psVar27 * 0x18),iVar14,iVar15);
                      }
                      else if (iVar13 == 2) {
                        fillPixels<Imath_3_2::half>
                                  ((Array2D<Imath_3_2::half> *)
                                   (psVar51[1] * uVar41 * 0x18 + psVar51[2] + (long)psVar27 * 0x18),
                                   iVar14,iVar15);
                      }
                      lVar38 = (long)psVar27 * 0x18;
                      setOutputFrameBuffer
                                (pFVar4 + (long)(lVar23 * uVar41 + (long)psVar27),
                                 *(int *)((anonymous_namespace)::pixelTypes + uVar48 * 4),
                                 *(Array2D<unsigned_int> **)
                                  (local_330[1] * uVar41 * 0x18 + local_330[2] + 0x10 + lVar38),
                                 *(Array2D<float> **)
                                  (psVar52[1] * uVar41 * 0x18 + psVar52[2] + 0x10 + lVar38),
                                 *(Array2D<Imath_3_2::half> **)
                                  (psVar51[1] * uVar41 * 0x18 + psVar51[2] + 0x10 + lVar38),iVar14);
                    }
                    uVar41 = uVar41 + 1;
                  } while (uVar25 != uVar41);
                }
                psVar27 = (size_type *)((long)psVar27 + 1);
              } while (psVar27 != local_338);
            }
          }
          uVar48 = uVar48 + 1;
        } while (uVar48 != local_308);
      }
      IlmThread_3_2::TaskGroup::TaskGroup((TaskGroup *)&local_368);
      pTVar28 = (ThreadPool *)operator_new(0x10);
      IlmThread_3_2::ThreadPool::ThreadPool(pTVar28,0x20);
      uVar42 = (uint)local_250;
      if ((int)uVar42 < 1) {
        local_388 = (pointer)0x0;
        local_390 = (pointer)0x0;
      }
      else {
        local_250 = (size_type *)-(ulong)(uVar42 & 0x7fffffff);
        local_338 = (size_type *)-(ulong)(uVar42 - 1);
        lVar23 = 0;
        __n = 0;
        psVar52 = (size_type *)0x0;
        local_390 = (pointer)0x0;
        local_388 = (pointer)0x0;
        ppWVar50 = (pointer)0x0;
        local_2f0 = pTVar28;
        do {
          pWVar46 = (WritingTaskData *)((long)local_218 + lVar23);
          iVar13 = (int)__n;
          local_330 = psVar52;
          if (ppWVar50 == local_388) {
            uVar48 = (long)local_388 - (long)local_390;
            if (uVar48 == 0x7ffffffffffffff8) {
              std::__throw_length_error("vector::_M_realloc_insert");
            }
            uVar41 = (long)uVar48 >> 3;
            uVar25 = 1;
            if (local_388 != local_390) {
              uVar25 = uVar41;
            }
            this_02 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       *)(uVar25 + uVar41);
            if ((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                 *)0xffffffffffffffe < this_02) {
              this_02 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)0xfffffffffffffff;
            }
            if (CARRY8(uVar25,uVar41)) {
              this_02 = (_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                         *)0xfffffffffffffff;
            }
            ppWVar29 = std::
                       _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       ::_M_allocate(this_02,__n);
            *(WritingTaskData **)((long)ppWVar29 + uVar48) = pWVar46;
            if (0 < (long)uVar48) {
              memmove(ppWVar29,local_390,uVar48);
            }
            if (local_390 != (pointer)0x0) {
              operator_delete(local_390,uVar48);
            }
            ppWVar50 = (pointer)(uVar48 + (long)ppWVar29);
            local_388 = ppWVar29 + (long)this_02;
            local_390 = ppWVar29;
          }
          else {
            *ppWVar50 = pWVar46;
          }
          ppWVar50 = ppWVar50 + 1;
          if (((int)(__n / 10) * -10 == (int)local_330) || (local_338 == local_330)) {
            local_300 = (Task *)operator_new(0x38);
            uVar48 = (long)ppWVar50 - (long)local_390;
            ppWVar29 = std::
                       _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                       ::_M_allocate((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                      *)((long)uVar48 >> 3),__n);
            if (ppWVar50 != local_390) {
              memmove(ppWVar29,local_390,uVar48);
            }
            pTVar36 = local_300;
            local_2e8 = local_2b8._data;
            __n_00 = (TaskGroup *)&local_368;
            IlmThread_3_2::Task::Task(local_300,__n_00);
            *(undefined ***)pTVar36 = &PTR__WritingTask_001ed270;
            *(Array2D<float> **)(pTVar36 + 0x10) = &local_358;
            *(undefined8 *)(pTVar36 + 0x18) = 0;
            *(undefined8 *)(pTVar36 + 0x20) = 0;
            *(undefined8 *)(pTVar36 + 0x28) = 0;
            __dest = std::
                     _Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                     ::_M_allocate((_Vector_base<(anonymous_namespace)::WritingTaskData_*,_std::allocator<(anonymous_namespace)::WritingTaskData_*>_>
                                    *)((long)uVar48 >> 3),(size_t)__n_00);
            pTVar28 = local_2f0;
            *(pointer *)(pTVar36 + 0x18) = __dest;
            *(pointer *)(pTVar36 + 0x20) = __dest;
            *(ulong *)(pTVar36 + 0x28) = (long)__dest + uVar48;
            if (ppWVar50 != local_390) {
              memcpy(__dest,ppWVar29,uVar48);
            }
            *(ulong *)(pTVar36 + 0x20) = (long)__dest + uVar48;
            *(Array2D<Imf_3_2::FrameBuffer> **)(pTVar36 + 0x30) = local_2e8;
            IlmThread_3_2::ThreadPool::addTask((Task *)pTVar28);
            ppWVar50 = local_390;
            if (ppWVar29 != (pointer)0x0) {
              operator_delete(ppWVar29,uVar48);
            }
          }
          psVar52 = (size_type *)((long)local_330 + -1);
          __n = (size_t)(iVar13 + 1);
          lVar23 = lVar23 + 0x14;
          pTVar28 = local_2f0;
        } while (local_250 != psVar52);
      }
      uVar48 = local_308;
      if (0 < (int)local_35c) {
        uVar25 = 0;
        do {
          operator_delete(*(void **)(local_1b8[0]._M_impl._0_8_ + uVar25 * 8),8);
          uVar25 = uVar25 + 1;
        } while (uVar48 != uVar25);
      }
      (**(code **)(*(long *)pTVar28 + 8))(pTVar28);
      sVar47 = *local_1e8;
      psVar52 = local_1e8;
      if (sVar47 != 0) {
        psVar51 = local_1e8 + sVar47 * 3 + 1;
        do {
          sVar3 = psVar51[-1];
          if (sVar3 != 0) {
            lVar23 = *(long *)(sVar3 - 8);
            if (lVar23 != 0) {
              lVar38 = lVar23 * 0x18;
              do {
                pvVar37 = *(void **)((long)(sVar3 - 8) + lVar38);
                if (pvVar37 != (void *)0x0) {
                  operator_delete__(pvVar37);
                }
                lVar38 = lVar38 + -0x18;
              } while (lVar38 != 0);
            }
            operator_delete__((void *)(sVar3 - 8),lVar23 * 0x18 + 8);
            psVar52 = local_1e8;
          }
          psVar51 = psVar51 + -3;
        } while (psVar51 != local_1e0);
      }
      operator_delete__(psVar52,sVar47 * 0x18 + 8);
      sVar47 = *local_1f8;
      psVar52 = local_1f8;
      if (sVar47 != 0) {
        psVar51 = local_1f8 + sVar47 * 3 + 1;
        do {
          sVar3 = psVar51[-1];
          if (sVar3 != 0) {
            lVar23 = *(long *)(sVar3 - 8);
            if (lVar23 != 0) {
              lVar38 = lVar23 * 0x18;
              do {
                pvVar37 = *(void **)((long)(sVar3 - 8) + lVar38);
                if (pvVar37 != (void *)0x0) {
                  operator_delete__(pvVar37);
                }
                lVar38 = lVar38 + -0x18;
              } while (lVar38 != 0);
            }
            operator_delete__((void *)(sVar3 - 8),lVar23 * 0x18 + 8);
            psVar52 = local_1f8;
          }
          psVar51 = psVar51 + -3;
        } while (psVar51 != local_1d0);
      }
      operator_delete__(psVar52,sVar47 * 0x18 + 8);
      sVar47 = *local_1f0;
      psVar52 = local_1f0;
      if (sVar47 != 0) {
        psVar51 = local_1f0 + sVar47 * 3 + 1;
        do {
          sVar3 = psVar51[-1];
          if (sVar3 != 0) {
            lVar23 = *(long *)(sVar3 - 8);
            if (lVar23 != 0) {
              lVar38 = lVar23 * 0x18;
              do {
                pvVar37 = *(void **)((long)(sVar3 - 8) + lVar38);
                if (pvVar37 != (void *)0x0) {
                  operator_delete__(pvVar37);
                }
                lVar38 = lVar38 + -0x18;
              } while (lVar38 != 0);
            }
            operator_delete__((void *)(sVar3 - 8),lVar23 * 0x18 + 8);
            psVar52 = local_1f0;
          }
          psVar51 = psVar51 + -3;
        } while (psVar51 != local_1d8);
      }
      operator_delete__(psVar52,sVar47 * 0x18 + 8);
      if (local_390 != (pointer)0x0) {
        operator_delete(local_390,(long)local_388 - (long)local_390);
      }
      IlmThread_3_2::TaskGroup::~TaskGroup((TaskGroup *)&local_368);
      Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_>::~Array(&local_2b8);
      std::vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_>::~vector
                ((vector<Imf_3_2::FrameBuffer,_std::allocator<Imf_3_2::FrameBuffer>_> *)local_288);
      if ((void *)local_1b8[0]._M_impl._0_8_ != (void *)0x0) {
        operator_delete((void *)local_1b8[0]._M_impl._0_8_,
                        (long)local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent -
                        local_1b8[0]._M_impl._0_8_);
      }
      Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)&local_358);
      if (local_218 != (void *)0x0) {
        operator_delete(local_218,local_208 - (long)local_218);
      }
      if ((Array2D<unsigned_int> *)local_2d8._data != (Array2D<unsigned_int> *)0x0) {
        operator_delete__(local_2d8._data);
      }
      if ((Array2D<float> *)local_328._data != (Array2D<float> *)0x0) {
        operator_delete__(local_328._data);
      }
      if ((Array2D<Imath_3_2::half> *)local_2a8._data != (Array2D<Imath_3_2::half> *)0x0) {
        operator_delete__(local_2a8._data);
      }
      plVar49 = local_248[0];
      local_288[0]._data = (uint *)0x0;
      local_288[0]._sizeX = 0;
      local_288[0]._sizeY = 0;
      local_358._data = (float *)0x0;
      local_358._sizeX = 0;
      local_358._sizeY = 0;
      local_2a8._data = (half *)0x0;
      local_2a8._sizeX = 0;
      local_2a8._sizeY = 0;
      iVar13 = Imf_3_2::globalThreadCount();
      uVar48 = 1;
      Imf_3_2::MultiPartInputFile::MultiPartInputFile
                ((MultiPartInputFile *)&local_2d8,(char *)plVar49,iVar13,true);
      uVar25 = 0;
      while( true ) {
        uVar16 = (undefined4)uVar48;
        iVar13 = Imf_3_2::MultiPartInputFile::parts();
        if ((ulong)(long)iVar13 <= uVar25) break;
        Imf_3_2::MultiPartInputFile::header((int)&local_2d8);
        puVar30 = (undefined8 *)Imf_3_2::Header::displayWindow();
        puVar31 = (undefined8 *)Imf_3_2::Header::displayWindow();
        iVar13 = -(uint)((int)*puVar31 == (int)*puVar30);
        iVar14 = -(uint)((int)((ulong)*puVar31 >> 0x20) == (int)((ulong)*puVar30 >> 0x20));
        auVar53._4_4_ = iVar13;
        auVar53._0_4_ = iVar13;
        auVar53._8_4_ = iVar14;
        auVar53._12_4_ = iVar14;
        iVar13 = movmskpd(uVar16,auVar53);
        if ((iVar13 != 3) ||
           (iVar14 = -(uint)((int)puVar31[1] == (int)puVar30[1]),
           iVar15 = -(uint)((int)((ulong)puVar31[1] >> 0x20) == (int)((ulong)puVar30[1] >> 0x20)),
           auVar54._4_4_ = iVar14, auVar54._0_4_ = iVar14, auVar54._8_4_ = iVar15,
           auVar54._12_4_ = iVar15, iVar14 = movmskpd((int)puVar31,auVar54), iVar14 != 3)) {
          __assert_fail("header.displayWindow () == headers[i].displayWindow ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x298,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        puVar30 = (undefined8 *)Imf_3_2::Header::dataWindow();
        puVar31 = (undefined8 *)Imf_3_2::Header::dataWindow();
        iVar14 = -(uint)((int)*puVar31 == (int)*puVar30);
        iVar15 = -(uint)((int)((ulong)*puVar31 >> 0x20) == (int)((ulong)*puVar30 >> 0x20));
        auVar55._4_4_ = iVar14;
        auVar55._0_4_ = iVar14;
        auVar55._8_4_ = iVar15;
        auVar55._12_4_ = iVar15;
        uVar42 = movmskpd(iVar13,auVar55);
        uVar48 = (ulong)uVar42;
        if ((uVar42 != 3) ||
           (iVar13 = -(uint)((int)puVar31[1] == (int)puVar30[1]),
           iVar14 = -(uint)((int)((ulong)puVar31[1] >> 0x20) == (int)((ulong)puVar30[1] >> 0x20)),
           auVar56._4_4_ = iVar13, auVar56._0_4_ = iVar13, auVar56._8_4_ = iVar14,
           auVar56._12_4_ = iVar14, iVar13 = movmskpd((int)puVar31,auVar56), iVar13 != 3)) {
          __assert_fail("header.dataWindow () == headers[i].dataWindow ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x299,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar32 = (float *)Imf_3_2::Header::pixelAspectRatio();
        fVar1 = *pfVar32;
        pfVar32 = (float *)Imf_3_2::Header::pixelAspectRatio();
        if ((fVar1 != *pfVar32) || (NAN(fVar1) || NAN(*pfVar32))) {
          __assert_fail("header.pixelAspectRatio () == headers[i].pixelAspectRatio ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29a,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar32 = (float *)Imf_3_2::Header::screenWindowCenter();
        pfVar33 = (float *)Imf_3_2::Header::screenWindowCenter();
        if ((((*pfVar32 != *pfVar33) || (NAN(*pfVar32) || NAN(*pfVar33))) ||
            (pfVar32[1] != pfVar33[1])) || (NAN(pfVar32[1]) || NAN(pfVar33[1]))) {
          __assert_fail("header.screenWindowCenter () == headers[i].screenWindowCenter ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29c,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        pfVar32 = (float *)Imf_3_2::Header::screenWindowWidth();
        fVar1 = *pfVar32;
        pfVar32 = (float *)Imf_3_2::Header::screenWindowWidth();
        if ((fVar1 != *pfVar32) || (NAN(fVar1) || NAN(*pfVar32))) {
          __assert_fail("header.screenWindowWidth () == headers[i].screenWindowWidth ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29d,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        piVar34 = (int *)Imf_3_2::Header::lineOrder();
        iVar13 = *piVar34;
        piVar34 = (int *)Imf_3_2::Header::lineOrder();
        if (iVar13 != *piVar34) {
          __assert_fail("header.lineOrder () == headers[i].lineOrder ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29e,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        piVar34 = (int *)Imf_3_2::Header::compression();
        iVar13 = *piVar34;
        piVar34 = (int *)Imf_3_2::Header::compression();
        if (iVar13 != *piVar34) {
          __assert_fail("header.compression () == headers[i].compression ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x29f,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        Imf_3_2::Header::channels();
        lVar23 = Imf_3_2::ChannelList::begin();
        Imf_3_2::Header::channels();
        lVar38 = Imf_3_2::ChannelList::begin();
        local_1b8[0]._M_impl._0_8_ = *(undefined8 *)(lVar23 + 0x120);
        local_1b8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ = *(ulong *)(lVar23 + 0x128);
        local_328._sizeX = *(long *)(lVar38 + 0x120);
        local_328._sizeY = *(long *)(lVar38 + 0x128);
        cVar11 = Imf_3_2::Channel::operator==((Channel *)local_1b8,(Channel *)&local_328);
        if (cVar11 == '\0') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," type ",6);
          poVar20 = (ostream *)std::ostream::operator<<(&std::cout,local_1b8[0]._M_impl._0_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
          poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)local_328._sizeX);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20," xSampling ",0xb);
          poVar20 = (ostream *)std::ostream::operator<<(poVar20,local_1b8[0]._M_impl._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
          poVar20 = (ostream *)std::ostream::operator<<(poVar20,local_328._sizeX._4_4_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20," ySampling ",0xb);
          poVar20 = (ostream *)
                    std::ostream::operator<<
                              (poVar20,local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_color
                              );
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
          poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)local_328._sizeY);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20," pLinear ",9);
          poVar20 = std::ostream::_M_insert<bool>(SUB81(poVar20,0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,", ",2);
          std::ostream::_M_insert<bool>(SUB81(poVar20,0));
          std::ostream::flush();
        }
        this_00 = (ChannelList *)Imf_3_2::Header::channels();
        pCVar35 = (ChannelList *)Imf_3_2::Header::channels();
        cVar11 = Imf_3_2::ChannelList::operator==(this_00,pCVar35);
        if (cVar11 == '\0') {
          __assert_fail("header.channels () == headers[i].channels ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x2b0,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        puVar30 = (undefined8 *)Imf_3_2::Header::name_abi_cxx11_();
        puVar31 = (undefined8 *)Imf_3_2::Header::name_abi_cxx11_();
        sVar5 = puVar30[1];
        if ((sVar5 != puVar31[1]) ||
           ((sVar5 != 0 && (iVar13 = bcmp((void *)*puVar30,(void *)*puVar31,sVar5), iVar13 != 0))))
        {
          __assert_fail("header.name () == headers[i].name ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x2b1,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        puVar30 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
        puVar31 = (undefined8 *)Imf_3_2::Header::type_abi_cxx11_();
        sVar5 = puVar30[1];
        if ((sVar5 != puVar31[1]) ||
           ((sVar5 != 0 && (iVar13 = bcmp((void *)*puVar30,(void *)*puVar31,sVar5), iVar13 != 0))))
        {
          __assert_fail("header.type () == headers[i].type ()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                        ,0x2b2,"void (anonymous namespace)::readWholeFiles(const std::string &)");
        }
        uVar25 = uVar25 + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reading whole files ",0x14);
      std::ostream::flush();
      local_328._sizeX = 0;
      local_328._sizeY = 0;
      local_328._data = (float *)0x0;
      uVar48 = ((long)DAT_001f0c20 - (long)(anonymous_namespace)::headers >> 3) * 0x6db6db6db6db6db7
      ;
      local_1b8[0]._M_impl._0_8_ = local_1b8[0]._M_impl._0_8_ & 0xffffffff00000000;
      uVar42 = (uint)uVar48;
      if (0 < (int)uVar42) {
        iVar13 = 0;
        do {
          if ((float *)local_328._sizeY == local_328._data) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_328,(iterator)local_328._sizeY,
                       (int *)local_1b8);
          }
          else {
            *(int *)local_328._sizeY = iVar13;
            local_328._sizeY = local_328._sizeY + 4;
          }
          iVar13 = local_1b8[0]._M_impl._0_4_ + 1;
          local_1b8[0]._M_impl._0_4_ = iVar13;
        } while (iVar13 < (int)uVar42);
        uVar48 = uVar48 & 0xffffffff;
        do {
          iVar13 = random_int(uVar42);
          iVar14 = random_int(uVar42);
          uVar16 = *(undefined4 *)(local_328._sizeX + (long)iVar13 * 4);
          *(undefined4 *)(local_328._sizeX + (long)iVar13 * 4) =
               *(undefined4 *)(local_328._sizeX + (long)iVar14 * 4);
          *(undefined4 *)(local_328._sizeX + (long)iVar14 * 4) = uVar16;
          uVar43 = (int)uVar48 - 1;
          uVar48 = (ulong)uVar43;
        } while (uVar43 != 0);
        psVar52 = (size_type *)0x0;
        do {
          iVar13 = *(int *)(local_328._sizeX + (long)psVar52 * 4);
          lVar23 = (long)iVar13;
          iVar14 = (int)(TiledInputPart *)&local_218;
          local_330 = psVar52;
          if (*(int *)((anonymous_namespace)::partTypes + lVar23 * 4) == 0) {
            local_1b8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 (ulong)(uint)local_1b8[0]._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
            local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_1b8[0]._M_impl.super__Rb_tree_header._M_header;
            local_1b8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
            setInputFrameBuffer((FrameBuffer *)local_1b8,
                                *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),local_288,
                                &local_358,&local_2a8,0xc5,0x107);
            Imf_3_2::InputPart::InputPart
                      ((InputPart *)&local_218,(MultiPartInputFile *)&local_2d8,iVar13);
            Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)&local_218);
            Imf_3_2::InputPart::readPixels(iVar14,0);
            iVar13 = *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4);
            if (iVar13 == 0) {
              bVar12 = checkPixels<unsigned_int>(local_288,0,0xc4,0,0x106,0xc5);
              if (!bVar12) {
                __assert_fail("checkPixels<unsigned int> (uData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                              ,0x2e2,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
            else if (iVar13 == 1) {
              bVar12 = checkPixels<float>(&local_358,0,0xc4,0,0x106,0xc5);
              if (!bVar12) {
                __assert_fail("checkPixels<float> (fData, width, height)",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                              ,0x2e5,
                              "void (anonymous namespace)::readWholeFiles(const std::string &)");
              }
            }
            else if ((iVar13 == 2) &&
                    (bVar12 = checkPixels<Imath_3_2::half>(&local_2a8,0,0xc4,0,0x106,0xc5), !bVar12)
                    ) {
              __assert_fail("checkPixels<half> (hData, width, height)",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                            ,0x2e8,"void (anonymous namespace)::readWholeFiles(const std::string &)"
                           );
            }
          }
          else {
            local_1b8[0]._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 (ulong)(uint)local_1b8[0]._M_impl.super__Rb_tree_header._M_header._4_4_ << 0x20;
            local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
            local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
                 &local_1b8[0]._M_impl.super__Rb_tree_header._M_header;
            local_1b8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
            local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
                 local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
            Imf_3_2::TiledInputPart::TiledInputPart
                      ((TiledInputPart *)&local_218,(MultiPartInputFile *)&local_2d8,iVar13);
            iVar13 = Imf_3_2::TiledInputPart::numXLevels();
            iVar15 = Imf_3_2::TiledInputPart::numYLevels();
            if (0 < iVar13) {
              iVar40 = 0;
              do {
                if (0 < iVar15) {
                  iVar44 = 0;
                  do {
                    cVar11 = Imf_3_2::TiledInputPart::isValidLevel(iVar14,iVar40);
                    if (cVar11 != '\0') {
                      width = Imf_3_2::TiledInputPart::levelWidth(iVar14);
                      iVar17 = Imf_3_2::TiledInputPart::levelHeight(iVar14);
                      setInputFrameBuffer((FrameBuffer *)local_1b8,
                                          *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4),
                                          local_288,&local_358,&local_2a8,0xc5,0x107);
                      Imf_3_2::TiledInputPart::setFrameBuffer((FrameBuffer *)&local_218);
                      iVar18 = Imf_3_2::TiledInputPart::numXTiles(iVar14);
                      iVar19 = Imf_3_2::TiledInputPart::numYTiles(iVar14);
                      Imf_3_2::TiledInputPart::readTiles(iVar14,0,iVar18 + -1,0,iVar19 + -1,iVar40);
                      iVar18 = *(int *)((anonymous_namespace)::pixelTypes + lVar23 * 4);
                      if (iVar18 == 0) {
                        bVar12 = checkPixels<unsigned_int>
                                           (local_288,0,width + -1,0,iVar17 + -1,width);
                        if (!bVar12) {
                          __assert_fail("checkPixels<unsigned int> (uData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                        ,0x30c,
                                        "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                       );
                        }
                      }
                      else if (iVar18 == 1) {
                        bVar12 = checkPixels<float>(&local_358,0,width + -1,0,iVar17 + -1,width);
                        if (!bVar12) {
                          __assert_fail("checkPixels<float> (fData, w, h)",
                                        "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                        ,0x30f,
                                        "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                       );
                        }
                      }
                      else if ((iVar18 == 2) &&
                              (bVar12 = checkPixels<Imath_3_2::half>
                                                  (&local_2a8,0,width + -1,0,iVar17 + -1,width),
                              !bVar12)) {
                        __assert_fail("checkPixels<half> (hData, w, h)",
                                      "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testMultiPartThreading.cpp"
                                      ,0x312,
                                      "void (anonymous namespace)::readWholeFiles(const std::string &)"
                                     );
                      }
                    }
                    iVar44 = iVar44 + 1;
                  } while (iVar15 != iVar44);
                }
                iVar40 = iVar40 + 1;
              } while (iVar40 != iVar13);
            }
          }
          std::
          _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
          ::~_Rb_tree(local_1b8);
          psVar52 = (size_type *)((long)local_330 + 1);
        } while (psVar52 != (size_type *)(ulong)(uVar42 & 0x7fffffff));
        if ((void *)local_328._sizeX != (void *)0x0) {
          operator_delete((void *)local_328._sizeX,(long)local_328._data - local_328._sizeX);
        }
      }
      Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)&local_2d8);
      if (local_2a8._data != (half *)0x0) {
        operator_delete__(local_2a8._data);
      }
      if (local_358._data != (float *)0x0) {
        operator_delete__(local_358._data);
      }
      if (local_288[0]._data != (uint *)0x0) {
        operator_delete__(local_288[0]._data);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Reading partial files ",0x16);
      std::ostream::flush();
      plVar49 = local_248[0];
      iVar13 = Imf_3_2::globalThreadCount();
      Imf_3_2::MultiPartInputFile::MultiPartInputFile
                ((MultiPartInputFile *)local_1b8,(char *)plVar49,iVar13,true);
      IlmThread_3_2::TaskGroup::TaskGroup((TaskGroup *)local_288);
      pTVar28 = (ThreadPool *)operator_new(0x10);
      IlmThread_3_2::ThreadPool::ThreadPool(pTVar28,0x20);
      iVar13 = local_220;
      if (0 < local_220) {
        do {
          pTVar36 = (Task *)operator_new(0x18);
          IlmThread_3_2::Task::Task(pTVar36,(TaskGroup *)local_288);
          *(undefined ***)pTVar36 = &PTR__Task_001ed2b0;
          *(_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
            **)(pTVar36 + 0x10) = local_1b8;
          IlmThread_3_2::ThreadPool::addTask((Task *)pTVar28);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
      (**(code **)(*(long *)pTVar28 + 8))(pTVar28);
      IlmThread_3_2::TaskGroup::~TaskGroup((TaskGroup *)local_288);
      Imf_3_2::MultiPartInputFile::~MultiPartInputFile((MultiPartInputFile *)local_1b8);
      remove((char *)local_248[0]);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
      iVar13 = local_21c;
      std::ostream::put('X');
      std::ostream::flush();
      std::ostream::flush();
      iVar13 = iVar13 + 1;
    } while (iVar13 != local_224);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  return;
}

Assistant:

void
testWriteRead (
    int                partNumber,
    int                runCount,
    int                randomReadCount,
    const std::string& tempDir)
{
    cout << "Testing file with " << partNumber << " part(s)." << endl << flush;

    std::string fn = tempDir + "imf_test_multipart_api.exr";

    for (int i = 0; i < runCount; i++)
    {
        generateRandomFile (partNumber, fn);
        readWholeFiles (fn);
        readPartialFiles (randomReadCount, fn);

        remove (fn.c_str ());

        cout << endl << flush;
    }
}